

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateWeightParamsUpdatable(Result *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  QuantizationParams *pQVar4;
  WeightParams *pWVar5;
  LayerUnion LVar6;
  RepeatedField<unsigned_long> *pRVar7;
  long *plVar8;
  long *plVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Result local_98;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  CoreML::Result::Result(&local_98);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x8c) {
    bVar10 = *(byte *)&(((layer->layer_).convolution_)->stride_).rep_;
    if (bVar10 == 1) {
      if (layer->_oneof_case_[0] == 0x8c) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.innerproduct_ = CoreML::Specification::InnerProductLayerParams::default_instance();
      }
      pWVar5 = (LVar6.innerproduct_)->bias_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      bVar3 = pWVar5->isupdatable_;
      if (layer->_oneof_case_[0] == 0x8c) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.innerproduct_ = CoreML::Specification::InnerProductLayerParams::default_instance();
      }
      pWVar5 = (LVar6.innerproduct_)->bias_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      bVar11 = pWVar5->quantization_ != (QuantizationParams *)0x0 &&
               pWVar5 != (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
    }
    else {
      bVar3 = 0;
      bVar11 = false;
    }
    if (layer->_oneof_case_[0] == 0x8c) {
      LVar6 = layer->layer_;
    }
    else {
      LVar6.innerproduct_ = CoreML::Specification::InnerProductLayerParams::default_instance();
    }
    pWVar5 = (WeightParams *)((LVar6.activation_)->NonlinearityType_).linear_;
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
    }
    pQVar4 = pWVar5->quantization_;
    if (layer->_oneof_case_[0] == 0x8c) {
      LVar6 = layer->layer_;
    }
    else {
      LVar6.innerproduct_ = CoreML::Specification::InnerProductLayerParams::default_instance();
    }
    bVar12 = pWVar5 != (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_ &&
             pQVar4 != (QuantizationParams *)0x0;
    pRVar7 = &(LVar6.convolution_)->kernelsize_;
LAB_002941a0:
    if ((bVar12) || (bVar11)) {
      std::operator+(&local_b8,"An updatable layer, named \'",(layer->name_).ptr_);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
    }
    else {
      pWVar5 = *(WeightParams **)pRVar7;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      if (((byte)(bVar3 | bVar10 ^ 1) == 1) && (pWVar5->isupdatable_ != false)) goto LAB_002941d3;
      std::operator+(&local_b8,"An updatable layer, named \'",(layer->name_).ptr_);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
    }
    plVar9 = plVar8 + 2;
    if ((long *)*plVar8 == plVar9) {
      local_60 = *plVar9;
      lStack_58 = plVar8[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar9;
      local_70 = (long *)*plVar8;
    }
    local_68 = plVar8[1];
    *plVar8 = (long)plVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,&local_50);
  }
  else {
    if (layer->_oneof_case_[0] == 100) {
      bVar10 = ((layer->layer_).convolution_)->hasbias_;
      if ((bool)bVar10 == true) {
        if (layer->_oneof_case_[0] == 100) {
          LVar6 = layer->layer_;
        }
        else {
          LVar6.convolution_ = CoreML::Specification::ConvolutionLayerParams::default_instance();
        }
        pWVar5 = (LVar6.convolution_)->bias_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
        }
        bVar3 = pWVar5->isupdatable_;
        if (layer->_oneof_case_[0] == 100) {
          LVar6 = layer->layer_;
        }
        else {
          LVar6.convolution_ = CoreML::Specification::ConvolutionLayerParams::default_instance();
        }
        pWVar5 = (LVar6.convolution_)->bias_;
        if (pWVar5 == (WeightParams *)0x0) {
          pWVar5 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
        }
        bVar11 = pWVar5->quantization_ != (QuantizationParams *)0x0 &&
                 pWVar5 != (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      else {
        bVar3 = 0;
        bVar11 = false;
      }
      if (layer->_oneof_case_[0] == 100) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.convolution_ = CoreML::Specification::ConvolutionLayerParams::default_instance();
      }
      pWVar5 = (LVar6.convolution_)->weights_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      pQVar4 = pWVar5->quantization_;
      if (layer->_oneof_case_[0] == 100) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.convolution_ = CoreML::Specification::ConvolutionLayerParams::default_instance();
      }
      bVar12 = pWVar5 != (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_ &&
               pQVar4 != (QuantizationParams *)0x0;
      pRVar7 = (RepeatedField<unsigned_long> *)&(LVar6.convolution_)->weights_;
      goto LAB_002941a0;
    }
LAB_002941d3:
    paVar2 = &local_98.m_message.field_2;
    __return_storage_ptr__->m_type = local_98.m_type;
    __return_storage_ptr__->m_reason = local_98.m_reason;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_message._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_98.m_message.field_2._M_allocated_capacity._1_7_,
                    local_98.m_message.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
           local_98.m_message.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_98.m_message._M_dataplus._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_98.m_message.field_2._M_allocated_capacity._1_7_,
                    local_98.m_message.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_98.m_message._M_string_length;
    local_98.m_message._M_string_length = 0;
    local_98.m_message.field_2._M_local_buf[0] = '\0';
    local_98.m_message._M_dataplus._M_p = (pointer)paVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_message._M_dataplus._M_p != &local_98.m_message.field_2) {
    operator_delete(local_98.m_message._M_dataplus._M_p,
                    CONCAT71(local_98.m_message.field_2._M_allocated_capacity._1_7_,
                             local_98.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateWeightParamsUpdatable(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    
    bool weight_update_flag = false;
    bool bias_update_flag = false;
    bool has_bias = false;
    bool weights_are_quantized = false;
    bool bias_is_quantized = false;
    
    std::string err;
    
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::kConvolution:
            has_bias = layer.convolution().hasbias();
            if (has_bias) {
                bias_update_flag = layer.convolution().bias().isupdatable();
                bias_is_quantized = layer.convolution().bias().has_quantization();
            }
            weights_are_quantized = layer.convolution().weights().has_quantization();
            weight_update_flag = layer.convolution().weights().isupdatable();
            break;
        case Specification::NeuralNetworkLayer::kInnerProduct:
            has_bias = layer.innerproduct().hasbias();
            if (has_bias) {
                bias_update_flag = layer.innerproduct().bias().isupdatable();
                bias_is_quantized = layer.innerproduct().bias().has_quantization();
            }
            weights_are_quantized = layer.innerproduct().weights().has_quantization();
            weight_update_flag = layer.innerproduct().weights().isupdatable();
            break;
        default:
            return r;
    }

    if (weights_are_quantized || bias_is_quantized) {
        err = "An updatable layer, named '" + layer.name() + "', has quantized weights/bias param. Quantized weights/bias not supported for update.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    if (!weight_update_flag || ((has_bias) && (!bias_update_flag))) {
        err = "An updatable layer, named '" + layer.name() + "', has a weight/bias param which is not marked as updatable.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    return r;
}